

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_no_field_presence.pb.cc
# Opt level: O2

void proto2_nofieldpresence_unittest::TestAllMapTypes::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  Nullable<const_char_*> failure_msg;
  TestAllMapTypes *_this;
  TestAllMapTypes *local_20;
  MessageLite *local_18 [2];
  
  local_20 = (TestAllMapTypes *)to_msg;
  local_18[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<proto2_nofieldpresence_unittest::TestAllMapTypes_const*,proto2_nofieldpresence_unittest::TestAllMapTypes*>
                          ((TestAllMapTypes **)local_18,&local_20,"&from != _this");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    google::protobuf::internal::
    TypeDefinedMapFieldBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::MergeFrom((TypeDefinedMapFieldBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&(local_20->field_0)._impl_,
                (TypeDefinedMapFieldBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(from_msg + 1));
    google::protobuf::internal::
    TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignEnum>::MergeFrom
              (&(local_20->field_0)._impl_.map_int32_foreign_enum_.
                super_TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignEnum>,
               (TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignEnum> *)
               (from_msg + 4));
    google::protobuf::internal::
    TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignMessage>::MergeFrom
              (&(local_20->field_0)._impl_.map_int32_foreign_message_.
                super_TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignMessage>,
               (TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignMessage> *)
               (from_msg + 7));
    google::protobuf::internal::
    TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage>::MergeFrom
              (&(local_20->field_0)._impl_.map_int32_explicit_foreign_message_.
                super_TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage>
               ,(TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage>
                 *)(from_msg + 10));
    google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(local_20->super_Message).super_MessageLite._internal_metadata_,
               &from_msg->_internal_metadata_);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest_no_field_presence.pb.cc"
             ,0xdaf,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_18);
}

Assistant:

void TestAllMapTypes::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestAllMapTypes*>(&to_msg);
  auto& from = static_cast<const TestAllMapTypes&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_nofieldpresence_unittest.TestAllMapTypes)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_impl_.map_int32_bytes_.MergeFrom(from._impl_.map_int32_bytes_);
  _this->_impl_.map_int32_foreign_enum_.MergeFrom(from._impl_.map_int32_foreign_enum_);
  _this->_impl_.map_int32_foreign_message_.MergeFrom(from._impl_.map_int32_foreign_message_);
  _this->_impl_.map_int32_explicit_foreign_message_.MergeFrom(from._impl_.map_int32_explicit_foreign_message_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}